

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void __thiscall
GEO::ParallelDelaunay3d::set_vertices(ParallelDelaunay3d *this,index_t nb_vertices,double *vertices)

{
  int *piVar1;
  index_t *piVar2;
  pointer pdVar3;
  pointer piVar4;
  double dVar5;
  index_t pool_end;
  uint uVar6;
  double dVar7;
  undefined8 uVar8;
  vector<int> *pvVar9;
  bool bVar10;
  index_t iVar11;
  Stopwatch *pSVar12;
  ostream *poVar13;
  Delaunay3dThread *pDVar14;
  pointer puVar15;
  index_t i;
  uint uVar16;
  pointer pSVar17;
  long lVar18;
  pointer piVar19;
  ulong uVar20;
  pointer piVar21;
  uint uVar22;
  index_t tot_failed_locate;
  pointer pSVar23;
  int iVar24;
  ParallelDelaunay3d *pPVar25;
  index_t tot_rollbacks;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  allocator local_a9;
  ParallelDelaunay3d *local_a8;
  string local_a0;
  Delaunay3dThread *local_80;
  Stopwatch *local_78;
  ulong local_70;
  vector<GEO::SmartPointer<GEO::Thread>,std::allocator<GEO::SmartPointer<GEO::Thread>>> *local_68;
  vector<unsigned_int> *local_60;
  double local_58;
  vector<int> *local_50;
  vector<int> *local_48;
  ulong local_40;
  ulong local_38;
  
  uVar28 = (ulong)nb_vertices;
  local_a8 = this;
  if (this->benchmark_mode_ == true) {
    pSVar12 = (Stopwatch *)operator_new(0x50);
    std::__cxx11::string::string((string *)&local_a0,"DelInternal",&local_a9);
    Stopwatch::Stopwatch(pSVar12,&local_a0,true);
    local_78 = pSVar12;
    std::__cxx11::string::~string((string *)&local_a0);
  }
  else {
    local_78 = (Stopwatch *)0x0;
  }
  pPVar25 = local_a8;
  if (local_a8->weighted_ == true) {
    std::vector<double,_GEO::Memory::aligned_allocator<double,_64>_>::resize
              (&(local_a8->heights_).
                super_vector<double,_GEO::Memory::aligned_allocator<double,_64>_>,uVar28);
    pdVar3 = (pPVar25->heights_).super_vector<double,_GEO::Memory::aligned_allocator<double,_64>_>.
             super__Vector_base<double,_GEO::Memory::aligned_allocator<double,_64>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar20 = 0; uVar28 * 4 - uVar20 != 0; uVar20 = uVar20 + 4) {
      dVar5 = vertices[(int)uVar20 + 1];
      dVar7 = (vertices + ((int)uVar20 + 1))[1];
      *(double *)((long)pdVar3 + uVar20 * 2) =
           dVar7 * dVar7 +
           vertices[uVar20 & 0xffffffff] * vertices[uVar20 & 0xffffffff] +
           vertices[(int)uVar20 + 3] * vertices[(int)uVar20 + 3] + dVar5 * dVar5;
    }
  }
  pPVar25 = local_a8;
  Delaunay::set_vertices(&local_a8->super_Delaunay,nb_vertices,vertices);
  uVar20 = (ulong)(nb_vertices * 7);
  local_48 = &pPVar25->cell_to_v_store_;
  local_a0._M_dataplus._M_p._0_4_ = 0xffffffff;
  std::vector<int,_GEO::Memory::aligned_allocator<int,_64>_>::_M_fill_assign
            (&local_48->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>,
             (ulong)(nb_vertices * 0x1c),(value_type_conflict2 *)&local_a0);
  local_50 = &pPVar25->cell_to_cell_store_;
  local_a0._M_dataplus._M_p._0_4_ = 0xffffffff;
  std::vector<int,_GEO::Memory::aligned_allocator<int,_64>_>::_M_fill_assign
            (&local_50->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>,
             (ulong)(nb_vertices * 0x1c),(value_type_conflict2 *)&local_a0);
  local_60 = &pPVar25->cell_next_;
  local_a0._M_dataplus._M_p._0_4_ = 0xffffffff;
  std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>::_M_fill_assign
            (&local_60->
              super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>,uVar20,
             (value_type_conflict1 *)&local_a0);
  local_a0._M_dataplus._M_p._0_1_ = 0xff;
  local_80 = (Delaunay3dThread *)uVar20;
  std::vector<unsigned_char,_GEO::Memory::aligned_allocator<unsigned_char,_64>_>::_M_fill_assign
            (&(pPVar25->cell_thread_).
              super_vector<unsigned_char,_GEO::Memory::aligned_allocator<unsigned_char,_64>_>,uVar20
             ,(value_type_conflict4 *)&local_a0);
  if ((pPVar25->super_Delaunay).do_reorder_ == true) {
    compute_BRIO_order(nb_vertices,(pPVar25->super_Delaunay).vertices_,&pPVar25->reorder_,3,
                       (uint)(byte)(pPVar25->super_Delaunay).super_Counted.field_0xc,0x40,0.125,
                       &pPVar25->levels_);
  }
  else {
    std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>::resize
              (&(pPVar25->reorder_).
                super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>,uVar28
              );
    puVar15 = (pPVar25->reorder_).
              super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
              super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
              _M_impl.super__Vector_impl_data._M_start;
    for (uVar20 = 0; uVar28 != uVar20; uVar20 = uVar20 + 1) {
      puVar15[uVar20] = (uint)uVar20;
    }
  }
  local_58 = 0.0;
  if (pPVar25->benchmark_mode_ == true) {
    local_58 = SystemStopwatch::elapsed_user_time(&local_78->W_);
    std::__cxx11::string::string((string *)&local_a0,"DelInternal1",&local_a9);
    poVar13 = Logger::out(&local_a0);
    std::operator<<(poVar13,"BRIO sorting:");
    poVar13 = std::ostream::_M_insert<double>(local_58);
    std::endl<char,std::char_traits<char>>(poVar13);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  uVar16 = 1;
  if (::(anonymous_namespace)::thread_manager_ != 0) {
    uVar16 = ::(anonymous_namespace)::max_threads_;
  }
  uVar28 = 1;
  if (::(anonymous_namespace)::multithreading_enabled_ != '\0') {
    uVar28 = (ulong)uVar16;
  }
  uVar20 = ((ulong)local_80 & 0xffffffff) / uVar28;
  local_68 = (vector<GEO::SmartPointer<GEO::Thread>,std::allocator<GEO::SmartPointer<GEO::Thread>>>
              *)&local_a8->threads_;
  std::vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>::
  clear((vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_> *)
        local_68);
  iVar11 = 0;
  while( true ) {
    pPVar25 = local_a8;
    iVar24 = (int)uVar28;
    uVar28 = (ulong)(iVar24 - 1);
    if (iVar24 == 0) break;
    pool_end = iVar11 + (int)uVar20;
    if (iVar24 == 1) {
      pool_end = (index_t)local_80;
    }
    pDVar14 = (Delaunay3dThread *)operator_new(0x2f80);
    Delaunay3dThread::Delaunay3dThread(pDVar14,local_a8,iVar11,pool_end);
    piVar1 = &(pDVar14->super_Thread).super_Counted.nb_refs_;
    *piVar1 = *piVar1 + 1;
    local_a0._M_dataplus._M_p = (pointer)pDVar14;
    std::vector<GEO::SmartPointer<GEO::Thread>,std::allocator<GEO::SmartPointer<GEO::Thread>>>::
    emplace_back<GEO::SmartPointer<GEO::Thread>>(local_68,(SmartPointer<GEO::Thread> *)&local_a0);
    SmartPointer<GEO::Thread>::~SmartPointer((SmartPointer<GEO::Thread> *)&local_a0);
    iVar11 = pool_end;
  }
  puVar15 = (local_a8->levels_).
            super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
            super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
            _M_impl.super__Vector_impl_data._M_start;
  iVar24 = (int)((ulong)((long)(local_a8->levels_).
                               super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                               .
                               super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)puVar15) >> 2);
  uVar16 = iVar24 - 1;
  uVar22 = iVar24 + -1 + (uint)(uVar16 == 0);
  for (uVar28 = 1; uVar28 < uVar16; uVar28 = uVar28 + 1) {
    if (999 < puVar15[uVar28]) {
      uVar22 = (uint)uVar28;
      break;
    }
  }
  if (local_a8->benchmark_mode_ == true) {
    std::__cxx11::string::string((string *)&local_a0,"PDEL",&local_a9);
    poVar13 = Logger::out(&local_a0);
    poVar13 = std::operator<<(poVar13,"Using ");
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
    poVar13 = std::operator<<(poVar13," levels");
    std::endl<char,std::char_traits<char>>(poVar13);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::string((string *)&local_a0,"PDEL",&local_a9);
    poVar13 = Logger::out(&local_a0);
    poVar13 = std::operator<<(poVar13,"Levels 0 - ");
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
    poVar13 = std::operator<<(poVar13,": bootstraping with first levels in sequential mode");
    std::endl<char,std::char_traits<char>>(poVar13);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  pDVar14 = (Delaunay3dThread *)
            ((pPVar25->threads_).
             super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->pointer_;
  Delaunay3dThread::create_first_tetrahedron(pDVar14);
  puVar15 = (pPVar25->levels_).
            super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
            super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar28 = (ulong)uVar22;
  uVar16 = puVar15[uVar28];
  pDVar14->work_begin_ = *puVar15;
  pDVar14->work_end_ = uVar16 - 1;
  local_80 = pDVar14;
  (*(pDVar14->super_Thread).super_Counted._vptr_Counted[2])(pDVar14);
  local_40 = uVar28;
  while( true ) {
    puVar15 = (pPVar25->levels_).
              super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
              super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(pPVar25->levels_).
                            super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                            .
                            super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar15) >> 2) - 1 <=
        uVar28) break;
    if (pPVar25->benchmark_mode_ != false) {
      std::__cxx11::string::string((string *)&local_a0,"PDEL",&local_a9);
      poVar13 = Logger::out(&local_a0);
      poVar13 = std::operator<<(poVar13,"Level ");
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
      poVar13 = std::operator<<(poVar13," : start");
      std::endl<char,std::char_traits<char>>(poVar13);
      std::__cxx11::string::~string((string *)&local_a0);
      puVar15 = (pPVar25->levels_).
                super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
                super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
                _M_impl.super__Vector_impl_data._M_start;
    }
    uVar16 = puVar15[uVar28];
    uVar22 = puVar15[uVar28 + 1];
    local_38 = uVar28 + 1;
    pSVar17 = (pPVar25->threads_).
              super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar23 = (pPVar25->threads_).
              super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    uVar20 = (long)pSVar23 - (long)pSVar17;
    uVar26 = 0;
    uVar27 = uVar16;
    local_70 = uVar28;
    while( true ) {
      uVar29 = (ulong)uVar26;
      uVar28 = (long)pSVar23 - (long)pSVar17 >> 3;
      if (uVar28 <= uVar29) break;
      uVar6 = uVar27 + (int)((ulong)(uVar22 - uVar16) / (uVar20 >> 3 & 0xffffffff));
      if (uVar28 - 1 == uVar29) {
        uVar6 = uVar22;
      }
      pDVar14 = (Delaunay3dThread *)pSVar17[uVar29].pointer_;
      if ((local_70 == local_40) && (uVar26 != 0)) {
        Delaunay3dThread::initialize_from(pDVar14,local_80);
        pSVar17 = (local_a8->threads_).
                  super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pSVar23 = (local_a8->threads_).
                  super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      pDVar14->work_begin_ = uVar27;
      pDVar14->work_end_ = uVar6 - 1;
      uVar26 = uVar26 + 1;
      uVar27 = uVar6;
    }
    Process::run_threads((ThreadGroup *)local_68);
    pPVar25 = local_a8;
    uVar28 = local_38;
  }
  if (pPVar25->benchmark_mode_ != false) {
    uVar16 = 0;
    while( true ) {
      if ((ulong)((long)(local_a8->threads_).
                        super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_a8->threads_).
                        super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) <= (ulong)uVar16) break;
      std::__cxx11::string::string((string *)&local_a0,"PDEL",&local_a9);
      poVar13 = Logger::out(&local_a0);
      poVar13 = std::operator<<(poVar13,"thread ");
      *(undefined8 *)(&poVar13->field_0x10 + (long)poVar13->_vptr_basic_ostream[-3]) = 3;
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
      poVar13 = std::operator<<(poVar13," : ");
      *(undefined8 *)(&poVar13->field_0x10 + (long)poVar13->_vptr_basic_ostream[-3]) = 3;
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
      poVar13 = std::operator<<(poVar13," rollbacks  ");
      *(undefined8 *)(&poVar13->field_0x10 + (long)poVar13->_vptr_basic_ostream[-3]) = 3;
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
      poVar13 = std::operator<<(poVar13," restarted locate");
      std::endl<char,std::char_traits<char>>(poVar13);
      std::__cxx11::string::~string((string *)&local_a0);
      uVar16 = uVar16 + 1;
    }
    std::__cxx11::string::string((string *)&local_a0,"PDEL",&local_a9);
    poVar13 = Logger::out(&local_a0);
    poVar13 = std::operator<<(poVar13,"------------------");
    std::endl<char,std::char_traits<char>>(poVar13);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::string((string *)&local_a0,"PDEL",&local_a9);
    poVar13 = Logger::out(&local_a0);
    poVar13 = std::operator<<(poVar13,"total: ");
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
    poVar13 = std::operator<<(poVar13," rollbacks  ");
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
    poVar13 = std::operator<<(poVar13," restarted locate");
    std::endl<char,std::char_traits<char>>(poVar13);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  iVar24 = 0;
  uVar16 = 0;
  while( true ) {
    pSVar12 = local_78;
    uVar28 = (ulong)uVar16;
    pSVar17 = (local_a8->threads_).
              super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar18 = (long)(local_a8->threads_).
                   super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar17;
    if ((ulong)(lVar18 >> 3) <= uVar28) break;
    pDVar14 = (Delaunay3dThread *)pSVar17[uVar28].pointer_;
    iVar11 = Delaunay3dThread::work_size(pDVar14);
    if (uVar28 != 0) {
      Delaunay3dThread::initialize_from
                (pDVar14,*(Delaunay3dThread **)(*(long *)local_68 + (ulong)(uVar16 - 1) * 8));
    }
    iVar24 = iVar24 + iVar11;
    (*(pDVar14->super_Thread).super_Counted._vptr_Counted[2])(pDVar14);
    uVar16 = uVar16 + 1;
  }
  if (iVar24 == 0) {
    if (local_a8->benchmark_mode_ == false) goto LAB_0015b300;
    std::__cxx11::string::string((string *)&local_a0,"PDEL",&local_a9);
    poVar13 = Logger::out(&local_a0);
    poVar13 = std::operator<<(poVar13,"All the points were inserted in parallel mode");
    std::endl<char,std::char_traits<char>>(poVar13);
  }
  else {
    Delaunay3dThread::initialize_from
              ((Delaunay3dThread *)pSVar17->pointer_,
               *(Delaunay3dThread **)((long)pSVar17 + lVar18 + -8));
    pSVar12 = local_78;
    if (local_a8->benchmark_mode_ != true) goto LAB_0015b300;
    std::__cxx11::string::string((string *)&local_a0,"PDEL",&local_a9);
    poVar13 = Logger::out(&local_a0);
    poVar13 = std::operator<<(poVar13,"Local thread memory overflow occurred:");
    std::endl<char,std::char_traits<char>>(poVar13);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::string((string *)&local_a0,"PDEL",&local_a9);
    poVar13 = Logger::out(&local_a0);
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
    poVar13 = std::operator<<(poVar13," points inserted in sequential mode");
    std::endl<char,std::char_traits<char>>(poVar13);
  }
  std::__cxx11::string::~string((string *)&local_a0);
LAB_0015b300:
  pPVar25 = local_a8;
  if (local_a8->benchmark_mode_ == true) {
    std::__cxx11::string::string((string *)&local_a0,"DelInternal2",&local_a9);
    poVar13 = Logger::out(&local_a0);
    std::operator<<(poVar13,"Core insertion algo:");
    dVar5 = SystemStopwatch::elapsed_user_time(&pSVar12->W_);
    poVar13 = std::ostream::_M_insert<double>(dVar5 - local_58);
    std::endl<char,std::char_traits<char>>(poVar13);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  if (pSVar12 != (Stopwatch *)0x0) {
    Stopwatch::~Stopwatch(pSVar12);
  }
  operator_delete(pSVar12);
  if (pPVar25->debug_mode_ == true) {
    for (uVar16 = 0; pDVar14 = local_80, pPVar25 = local_a8,
        (ulong)uVar16 <
        (ulong)((long)(local_a8->threads_).
                      super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_a8->threads_).
                      super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3); uVar16 = uVar16 + 1) {
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      poVar13 = std::operator<<(poVar13," : ");
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
      std::endl<char,std::char_traits<char>>(poVar13);
    }
    Delaunay3dThread::check_combinatorics(local_80,local_a8->verbose_debug_mode_);
    Delaunay3dThread::check_geometry(pDVar14,pPVar25->verbose_debug_mode_);
  }
  if (pPVar25->benchmark_mode_ == true) {
    pSVar12 = (Stopwatch *)operator_new(0x50);
    std::__cxx11::string::string((string *)&local_a0,"DelCompress",&local_a9);
    Stopwatch::Stopwatch(pSVar12,&local_a0,true);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  uVar29 = 0;
  uVar28 = 0;
  uVar20 = 0;
  local_70 = local_70 & 0xffffffff00000000;
  do {
    iVar24 = (int)uVar20;
    if (local_80->max_t_ <= uVar28) {
      uVar29 = (ulong)(uint)(iVar24 * 4);
      std::vector<int,_GEO::Memory::aligned_allocator<int,_64>_>::resize
                (&local_48->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>,uVar29);
      pvVar9 = local_50;
      std::vector<int,_GEO::Memory::aligned_allocator<int,_64>_>::resize
                (&local_50->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>,uVar29);
      piVar4 = (pvVar9->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
               super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar15 = (local_60->
                super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
                super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
                _M_impl.super__Vector_impl_data._M_start;
      for (uVar28 = 0; uVar29 != uVar28; uVar28 = uVar28 + 1) {
        piVar4[uVar28] = puVar15[(uint)piVar4[uVar28]];
      }
      if ((local_a8->super_Delaunay).keep_infinite_ != false) {
        (local_a8->super_Delaunay).nb_finite_cells_ = 0;
        uVar16 = 0;
        uVar28 = uVar20;
        local_78 = pSVar12;
        local_40 = uVar29;
        while( true ) {
          uVar22 = uVar16 * 4;
          while( true ) {
            bVar10 = Delaunay3dThread::tet_is_finite(local_80,uVar16);
            if (!bVar10) break;
            (local_a8->cell_next_).
            super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
            super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar16] = uVar16;
            uVar16 = uVar16 + 1;
            piVar2 = &(local_a8->super_Delaunay).nb_finite_cells_;
            *piVar2 = *piVar2 + 1;
            uVar22 = uVar22 + 4;
          }
          uVar26 = (uint)uVar28;
          uVar27 = uVar26 * 4;
          while( true ) {
            uVar26 = uVar26 - 1;
            uVar27 = uVar27 - 4;
            uVar28 = (ulong)uVar26;
            bVar10 = Delaunay3dThread::tet_is_finite(local_80,uVar26);
            puVar15 = (local_60->
                      super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>)
                      .
                      super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (bVar10) break;
            puVar15[uVar28] = uVar26;
          }
          if (uVar26 < uVar16) break;
          puVar15[uVar16] = uVar26;
          puVar15[uVar28] = uVar16;
          piVar2 = &(local_a8->super_Delaunay).nb_finite_cells_;
          *piVar2 = *piVar2 + 1;
          piVar4 = (local_a8->cell_to_cell_store_).
                   super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                   super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                   super__Vector_impl_data._M_start;
          for (lVar18 = 0; lVar18 != 4; lVar18 = lVar18 + 1) {
            iVar24 = piVar4[(ulong)uVar22 + lVar18];
            piVar4[(ulong)uVar22 + lVar18] = piVar4[(ulong)uVar27 + lVar18];
            piVar4[(ulong)uVar27 + lVar18] = iVar24;
          }
          piVar4 = (local_48->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
                   super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                   super__Vector_impl_data._M_start;
          for (lVar18 = 0; lVar18 != 4; lVar18 = lVar18 + 1) {
            iVar24 = piVar4[(ulong)uVar22 + lVar18];
            piVar4[(ulong)uVar22 + lVar18] = piVar4[(ulong)uVar27 + lVar18];
            piVar4[(ulong)uVar27 + lVar18] = iVar24;
          }
          uVar16 = uVar16 + 1;
        }
        piVar4 = (local_50->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
                 super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (uVar28 = 0; pSVar12 = local_78, local_40 != uVar28; uVar28 = uVar28 + 1) {
          piVar4[uVar28] = puVar15[(uint)piVar4[uVar28]];
        }
      }
      pPVar25 = local_a8;
      if (local_a8->benchmark_mode_ == true) {
        if ((local_a8->super_Delaunay).keep_infinite_ == true) {
          std::__cxx11::string::string((string *)&local_a0,"DelCompress",&local_a9);
          poVar13 = Logger::out(&local_a0);
          poVar13 = std::operator<<(poVar13,"Removed ");
          poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
          poVar13 = std::operator<<(poVar13," tets (free list)");
          std::endl<char,std::char_traits<char>>(poVar13);
        }
        else {
          std::__cxx11::string::string((string *)&local_a0,"DelCompress",&local_a9);
          poVar13 = Logger::out(&local_a0);
          poVar13 = std::operator<<(poVar13,"Removed ");
          poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
          poVar13 = std::operator<<(poVar13," tets (free list and infinite)");
          std::endl<char,std::char_traits<char>>(poVar13);
        }
        std::__cxx11::string::~string((string *)&local_a0);
      }
      if (pSVar12 != (Stopwatch *)0x0) {
        Stopwatch::~Stopwatch(pSVar12);
      }
      operator_delete(pSVar12);
      piVar4 = (pPVar25->cell_to_v_store_).
               super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
               super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar21 = (pointer)((long)(pPVar25->cell_to_v_store_).
                                super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                                super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)piVar4 &
                         0x3fffffffc);
      if (piVar21 != (pointer)0x0) {
        piVar21 = piVar4;
      }
      piVar4 = (pPVar25->cell_to_cell_store_).
               super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
               super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar19 = (pointer)((long)(pPVar25->cell_to_cell_store_).
                                super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                                super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)piVar4 &
                         0x3fffffffc);
      if (piVar19 != (pointer)0x0) {
        piVar19 = piVar4;
      }
      (*(pPVar25->super_Delaunay).super_Counted._vptr_Counted[9])(pPVar25,uVar20,piVar21,piVar19);
      return;
    }
    if (((pPVar25->super_Delaunay).keep_infinite_ == true) &&
       (*(int *)((long)(local_80->cell_next_->
                       super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                       ).
                       super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar29) == -2)) {
LAB_0015b4bb:
      if (uVar28 != uVar20) {
        piVar21 = (local_48->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
                  super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar4 = piVar21 + (uVar29 & 0xffffffff);
        uVar8 = *(undefined8 *)(piVar4 + 2);
        piVar21 = piVar21 + (uint)(iVar24 * 4);
        *(undefined8 *)piVar21 = *(undefined8 *)piVar4;
        *(undefined8 *)(piVar21 + 2) = uVar8;
        piVar21 = (local_50->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
                  super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar4 = piVar21 + (uVar29 & 0xffffffff);
        uVar8 = *(undefined8 *)(piVar4 + 2);
        piVar21 = piVar21 + (uint)(iVar24 * 4);
        *(undefined8 *)piVar21 = *(undefined8 *)piVar4;
        *(undefined8 *)(piVar21 + 2) = uVar8;
      }
      *(int *)((long)(local_60->
                     super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
                     super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar29) = iVar24;
      uVar20 = (ulong)(iVar24 + 1);
    }
    else {
      bVar10 = Delaunay3dThread::tet_is_real(local_80,(index_t)uVar28);
      if (bVar10) goto LAB_0015b4bb;
      *(undefined4 *)
       ((long)(local_60->
              super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
              super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
              _M_impl.super__Vector_impl_data._M_start + uVar29) = 0xffffffff;
      local_70 = CONCAT44(local_70._4_4_,(int)local_70 + 1);
    }
    uVar28 = uVar28 + 1;
    uVar29 = uVar29 + 4;
  } while( true );
}

Assistant:

void ParallelDelaunay3d::set_vertices(
        index_t nb_vertices, const double* vertices
    ) {
        Stopwatch* W = nullptr ;
        if(benchmark_mode_) {
            W = new Stopwatch("DelInternal");
        }

        if(weighted_) {
            heights_.resize(nb_vertices);
            for(index_t i = 0; i < nb_vertices; ++i) {
                // Client code uses 4d embedding with ti = sqrt(W - wi)
                //   where W = max(wi)
                // We recompute the standard "shifted" lifting on
                // the paraboloid from it.
                // (we use wi - W, everything is shifted by W, but
                // we do not care since the power diagram is invariant
                // by a translation of all weights).
                double w = -geo_sqr(vertices[4 * i + 3]);
                heights_[i] = -w +
                    geo_sqr(vertices[4 * i]) +
                    geo_sqr(vertices[4 * i + 1]) +
                    geo_sqr(vertices[4 * i + 2]);
            }
        }
        Delaunay::set_vertices(nb_vertices, vertices);

        index_t expected_tetra = nb_vertices * 7;
    
        // Allocate the tetrahedra
        cell_to_v_store_.assign(expected_tetra * 4,-1);
        cell_to_cell_store_.assign(expected_tetra * 4,-1);
        cell_next_.assign(expected_tetra,index_t(-1));
        cell_thread_.assign(expected_tetra,thread_index_t(-1));

        // Reorder the points
        if(do_reorder_) {
            compute_BRIO_order(
                nb_vertices, vertex_ptr(0), reorder_,
		3, dimension(),
                64, 0.125,
                &levels_
            );        
        } else {
            reorder_.resize(nb_vertices);
            for(index_t i = 0; i < nb_vertices; ++i) {
                reorder_[i] = i;
            }
            geo_debug_assert(levels_[0] == 0);
            geo_debug_assert(levels_[levels_.size()-1] == nb_vertices);
        }

        double sorting_time = 0;
        if(benchmark_mode_) {
            sorting_time = W->elapsed_time();
            Logger::out("DelInternal1") << "BRIO sorting:"
                                       << sorting_time
                                       << std::endl;
        } 

        // Create the threads
        index_t nb_threads = Process::maximum_concurrent_threads();
        index_t pool_size = expected_tetra / nb_threads;
        index_t pool_begin = 0;
        threads_.clear();
        for(index_t t=0; t<nb_threads; ++t) {
            index_t pool_end = 
                (t == nb_threads - 1) ? expected_tetra : pool_begin + pool_size;
            threads_.push_back(
                new Delaunay3dThread(this, pool_begin, pool_end)
            );
            pool_begin = pool_end;
        }


        // Create first tetrahedron and triangulate first set of points 
        // in sequential mode.


        index_t lvl = 1;
        while(lvl < (levels_.size() - 1) && levels_[lvl] < 1000) {
            ++lvl;
        }

        if(benchmark_mode_) {
            Logger::out("PDEL")
                << "Using " << levels_.size()-1 << " levels" << std::endl;
            Logger::out("PDEL") 
                << "Levels 0 - " << lvl-1 
                << ": bootstraping with first levels in sequential mode"
                << std::endl;
        }
        Delaunay3dThread* thread0 = 
                    static_cast<Delaunay3dThread*>(threads_[0].get());
        thread0->create_first_tetrahedron();
        thread0->set_work(levels_[0], levels_[lvl]);
        thread0->run();

        index_t first_lvl = lvl;

        // Insert points in all BRIO levels
        for(; lvl<levels_.size()-1; ++lvl) {

            if(benchmark_mode_) {
                Logger::out("PDEL") << "Level " 
                                    << lvl << " : start" << std::endl;
            }

            index_t lvl_b = levels_[lvl];
            index_t lvl_e = levels_[lvl+1];
            index_t work_size = (lvl_e - lvl_b)/index_t(threads_.size());

            // Initialize threads
            index_t b = lvl_b;
            for(index_t t=0; t<threads_.size(); ++t) {
                index_t e = t == threads_.size()-1 ? lvl_e : b+work_size;
                Delaunay3dThread* thread = 
                    static_cast<Delaunay3dThread*>(threads_[t].get());
                
                // Copy the indices of the first created tetrahedron
                // and the maximum valid tetrahedron index max_t_
                if(lvl == first_lvl && t!=0) {
                    thread->initialize_from(thread0);
                }
                thread->set_work(b,e);
                b = e;
            }
            Process::run_threads(threads_);
        }


        if(benchmark_mode_) {
            index_t tot_rollbacks = 0 ;
            index_t tot_failed_locate = 0 ;
            for(index_t t=0; t<threads_.size(); ++t) {
                Delaunay3dThread* thread = 
                    static_cast<Delaunay3dThread*>(threads_[t].get());
                Logger::out("PDEL") 
                    << "thread " << std::setw(3) << t << " : " 
                    << std::setw(3) << thread->nb_rollbacks() << " rollbacks  "
                    << std::setw(3) << thread->nb_failed_locate() << " restarted locate"
                    << std::endl;
                tot_rollbacks += thread->nb_rollbacks();
                tot_failed_locate += thread->nb_failed_locate();
            }
            Logger::out("PDEL") << "------------------" << std::endl;
            Logger::out("PDEL") << "total: " 
                                << tot_rollbacks << " rollbacks  "
                                << tot_failed_locate << " restarted locate"
                                << std::endl;
        }

        // Run threads sequentialy, to insert missing points if
        // memory overflow was encountered (in sequential mode,
        // dynamic memory growing works)

        index_t nb_sequential_points = 0;
        for(index_t t=0; t<threads_.size(); ++t) {
            Delaunay3dThread* t1 = 
                static_cast<Delaunay3dThread*>(threads_[t].get());

            nb_sequential_points += t1->work_size();

            if(t != 0) {
                // We need to copy max_t_ from previous thread, 
                // since the memory pool may have grown.
                Delaunay3dThread* t2 = 
                    static_cast<Delaunay3dThread*>(threads_[t-1].get());
                t1->initialize_from(t2);
            }
            t1->run();
        }

        //  If some tetrahedra were created in sequential mode, then
        // the maximum valid tetrahedron index was increased by all
        // the threads in increasing number, so we copy it from the
        // last thread into thread0 since we use thread0 afterwards
        // to do the "compaction" afterwards.
        
        if(nb_sequential_points != 0) {
            Delaunay3dThread* t0 = 
                static_cast<Delaunay3dThread*>(threads_[0].get());
            Delaunay3dThread* tn = 
                static_cast<Delaunay3dThread*>(
                    threads_[threads_.size()-1].get()
                );
            t0->initialize_from(tn);
        }
        

        
        if(benchmark_mode_) {
            if(nb_sequential_points != 0) {
                Logger::out("PDEL") << "Local thread memory overflow occurred:"
                                    << std::endl;
                Logger::out("PDEL") << nb_sequential_points
                                    << " points inserted in sequential mode"
                                    << std::endl;
            } else {
                Logger::out("PDEL") 
                    << "All the points were inserted in parallel mode"
                    << std::endl;
            }
        }

        if(benchmark_mode_) {
            Logger::out("DelInternal2") << "Core insertion algo:"
                                       << W->elapsed_time() - sorting_time
                                       << std::endl;
        }
        delete W;

        if(debug_mode_) {
            for(index_t i=0; i<threads_.size(); ++i) {
                std::cerr << i << " : " <<
                    static_cast<Delaunay3dThread*>(threads_[i].get())
                    ->max_t() << std::endl;
            }
            
            thread0->check_combinatorics(verbose_debug_mode_);
            thread0->check_geometry(verbose_debug_mode_);
        }

        if(benchmark_mode_) {
            W = new Stopwatch("DelCompress");
        }

        //   Compress cell_to_v_store_ and cell_to_cell_store_
        // (remove free and virtual tetrahedra).
        //   Since cell_next_ is not used at this point,
        // we reuse it for storing the conversion array that
        // maps old tet indices to new tet indices
        // Note: tet_is_real() uses the previous value of 
        // cell_next(), but we are processing indices
        // in increasing order and since old2new[t] is always
        // smaller or equal to t, we never overwrite a value
        // before needing it.
        
        vector<index_t>& old2new = cell_next_;
        index_t nb_tets = 0;
        index_t nb_tets_to_delete = 0;

        {
            for(index_t t = 0; t < thread0->max_t(); ++t) {
                if(
                    (keep_infinite_ && !thread0->tet_is_free(t)) ||
                    thread0->tet_is_real(t)
                ) {
                    if(t != nb_tets) {
                        Memory::copy(
                            &cell_to_v_store_[nb_tets * 4],
                            &cell_to_v_store_[t * 4],
                            4 * sizeof(signed_index_t)
                        );
                        Memory::copy(
                            &cell_to_cell_store_[nb_tets * 4],
                            &cell_to_cell_store_[t * 4],
                            4 * sizeof(signed_index_t)
                        );
                    }
                    old2new[t] = nb_tets;
                    ++nb_tets;
                } else {
                    old2new[t] = index_t(-1);
                    ++nb_tets_to_delete;
                }
            }

            cell_to_v_store_.resize(4 * nb_tets);
            cell_to_cell_store_.resize(4 * nb_tets);
            for(index_t i = 0; i < 4 * nb_tets; ++i) {
                signed_index_t t = cell_to_cell_store_[i];
                geo_debug_assert(t >= 0);
                t = signed_index_t(old2new[t]);
                // Note: t can be equal to -1 when a real tet is
                // adjacent to a virtual one (and this is how the
                // rest of Vorpaline expects to see tets on the
                // border).
                geo_debug_assert(!(keep_infinite_ && t < 0));
                cell_to_cell_store_[i] = t;
            }
        }

        // In "keep_infinite" mode, we reorder the cells in such
        // a way that finite cells have indices [0..nb_finite_cells_-1]
        // and infinite cells have indices [nb_finite_cells_ .. nb_cells_-1]
        
        if(keep_infinite_) {
            nb_finite_cells_ = 0;
            index_t finite_ptr = 0;
            index_t infinite_ptr = nb_tets - 1;
            for(;;) {
                while(thread0->tet_is_finite(finite_ptr)) {
                    old2new[finite_ptr] = finite_ptr;
                    ++finite_ptr;
                    ++nb_finite_cells_;
                }
                while(!thread0->tet_is_finite(infinite_ptr)) {
                    old2new[infinite_ptr] = infinite_ptr;
                    --infinite_ptr;
                }
                if(finite_ptr > infinite_ptr) {
                    break;
                }
                old2new[finite_ptr] = infinite_ptr;
                old2new[infinite_ptr] = finite_ptr;
                ++nb_finite_cells_;
                for(index_t lf=0; lf<4; ++lf) {
                    std::swap(
                        cell_to_cell_store_[4*finite_ptr + lf],
                        cell_to_cell_store_[4*infinite_ptr + lf]
                    );
                }
                for(index_t lv=0; lv<4; ++lv) {
                    std::swap(
                        cell_to_v_store_[4*finite_ptr + lv],
                        cell_to_v_store_[4*infinite_ptr + lv]
                    );
                }
                ++finite_ptr;
                --infinite_ptr;
            }
            for(index_t i = 0; i < 4 * nb_tets; ++i) {
                signed_index_t t = cell_to_cell_store_[i];
                geo_debug_assert(t >= 0);
                t = signed_index_t(old2new[t]);
                geo_debug_assert(t >= 0);
                cell_to_cell_store_[i] = t;
            }
        }
        
        
        if(benchmark_mode_) {
            if(keep_infinite_) {
                Logger::out("DelCompress") 
                    << "Removed " << nb_tets_to_delete 
                    << " tets (free list)" << std::endl;
            } else {
                Logger::out("DelCompress") 
                    << "Removed " << nb_tets_to_delete 
                    << " tets (free list and infinite)" << std::endl;
            }
        }

        delete W;

        set_arrays(
            nb_tets,
            cell_to_v_store_.data(),
            cell_to_cell_store_.data()
        );
    }